

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFilteringTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::Texture2DFilteringCase::init
          (Texture2DFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *this_00;
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Texture2D *pTVar5;
  uint uVar6;
  bool bVar7;
  long lVar8;
  pointer ppTVar9;
  ulong uVar10;
  long lVar11;
  float fVar12;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  deUint32 step;
  Vec4 gMax;
  Vec4 gMin;
  TextureFormatInfo fmtInfo;
  Vector<float,_4> res_3;
  RGBA local_110;
  RGBA local_10c;
  undefined8 local_108;
  float afStack_100 [2];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  Vec4 local_c8;
  Vec4 local_b8;
  ulong local_a8;
  ulong local_a0;
  TextureFormatInfo local_98;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  Vec4 local_48;
  
  this_00 = &this->m_textures;
  if ((this->m_filenames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->m_filenames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(this_00,2);
    bVar2 = true;
    do {
      bVar7 = bVar2;
      pTVar5 = (Texture2D *)operator_new(0x70);
      glu::Texture2D::Texture2D
                (pTVar5,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,
                 this->m_height);
      local_98.valueMin.m_data._0_8_ = pTVar5;
      std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::emplace_back<glu::Texture2D*>
                ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
                 (Texture2D **)&local_98);
      bVar2 = false;
    } while (bVar7);
    uVar6 = this->m_width;
    uVar10 = 1;
    if (((uVar6 & uVar6 - 1) == 0) && (uVar1 = this->m_height, (uVar1 & uVar1 - 1) == 0)) {
      if ((int)uVar1 < (int)uVar6) {
        uVar1 = uVar6;
      }
      uVar6 = 0x20;
      if (uVar1 != 0) {
        uVar6 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar6 = uVar6 ^ 0x1f;
      }
      uVar10 = (ulong)(0x20 - uVar6);
    }
    tcu::getTextureFormatInfo
              (&local_98,
               (TextureFormat *)
               &(*(this_00->super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start)->m_refTexture);
    if ((int)uVar10 != 0) {
      local_e8._0_4_ = local_98.valueMax.m_data[0] - local_98.valueMin.m_data[0];
      local_e8._4_4_ = local_98.valueMax.m_data[1] - local_98.valueMin.m_data[1];
      fStack_e0 = local_98.valueMax.m_data[2] - local_98.valueMin.m_data[2];
      fStack_dc = local_98.valueMax.m_data[3] - local_98.valueMin.m_data[3];
      local_f8._4_4_ = (float)local_e8._4_4_ * -0.5 + local_98.valueMin.m_data[1];
      local_f8._0_4_ = (float)local_e8._0_4_ * -0.5 + local_98.valueMin.m_data[0];
      fStack_f0 = fStack_e0 * -0.5 + local_98.valueMin.m_data[2];
      fStack_ec = fStack_dc * 2.0 + local_98.valueMin.m_data[3];
      local_d8 = (Texture2D *)local_98.valueMin.m_data._0_8_;
      uStack_d0 = CONCAT44(local_98.valueMin.m_data[3],local_98.valueMin.m_data[2]);
      local_108 = CONCAT44((float)local_e8._4_4_ * 1.0 + local_98.valueMin.m_data[1],
                           (float)local_e8._0_4_ * 1.0 + local_98.valueMin.m_data[0]);
      afStack_100[1] = fStack_dc * 0.0 + local_98.valueMin.m_data[3];
      afStack_100[0] = fStack_e0 * 1.0 + local_98.valueMin.m_data[2];
      local_a8 = (ulong)(uint)((int)uVar10 * 8);
      lVar8 = local_a8 * 5;
      lVar11 = 0;
      iVar3 = 0;
      local_a0 = uVar10;
      do {
        auVar14 = _local_f8;
        local_b8.m_data[0] = (float)local_f8._0_4_;
        local_b8.m_data[1] = (float)local_f8._4_4_;
        local_b8.m_data[2] = fStack_f0;
        local_b8.m_data[3] = fStack_ec;
        local_c8.m_data[0] = (float)local_108;
        local_c8.m_data[1] = local_108._4_4_;
        local_c8.m_data[2] = afStack_100[0];
        local_c8.m_data[3] = afStack_100[1];
        _local_f8 = auVar14;
        tcu::Texture2D::allocLevel
                  (&(*(this_00->
                      super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                      _M_impl.super__Vector_impl_data._M_start)->m_refTexture,iVar3);
        tcu::fillWithComponentGradients
                  ((PixelBufferAccess *)
                   (*(long *)&((*(this_00->
                                 super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->m_refTexture).
                              super_TextureLevelPyramid.m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl + lVar11),&local_b8,&local_c8);
        iVar3 = iVar3 + 1;
        lVar11 = lVar11 + 0x28;
      } while (lVar8 != lVar11);
      if ((int)local_a0 != 0) {
        lVar8 = 0;
        local_f8._0_4_ = (int)(0xffffff / (local_a0 & 0xffffffff));
        local_108 = local_a8 * 5;
        iVar3 = 0;
        do {
          tcu::Texture2D::allocLevel
                    (&(this_00->
                      super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                      _M_impl.super__Vector_impl_data._M_start[1]->m_refTexture,iVar3);
          uVar6 = local_f8._0_4_ * iVar3;
          local_10c.m_value = uVar6 | 0xff000000;
          lVar11 = *(long *)&((this_00->
                              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                              )._M_impl.super__Vector_impl_data._M_start[1]->m_refTexture).
                             super_TextureLevelPyramid.m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl;
          tcu::RGBA::toVec(&local_10c);
          local_110.m_value = ~uVar6 | 0xff000000;
          local_b8.m_data[1] = local_c8.m_data[1] * (float)local_e8._4_4_ + local_d8._4_4_;
          local_b8.m_data[0] = local_c8.m_data[0] * (float)local_e8._0_4_ + (float)local_d8;
          local_b8.m_data[3] = local_c8.m_data[3] * fStack_dc + uStack_d0._4_4_;
          local_b8.m_data[2] = local_c8.m_data[2] * fStack_e0 + (float)uStack_d0;
          tcu::RGBA::toVec(&local_110);
          local_48.m_data[0] = local_58 * (float)local_e8._0_4_ + (float)local_d8;
          local_48.m_data[1] = fStack_54 * (float)local_e8._4_4_ + local_d8._4_4_;
          local_48.m_data[2] = fStack_50 * fStack_e0 + (float)uStack_d0;
          local_48.m_data[3] = fStack_4c * fStack_dc + uStack_d0._4_4_;
          tcu::fillWithGrid((PixelBufferAccess *)(lVar11 + lVar8),4,&local_b8,&local_48);
          iVar3 = iVar3 + 1;
          lVar8 = lVar8 + 0x28;
        } while (local_108 != lVar8);
      }
    }
    for (ppTVar9 = (this->m_textures).
                   super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppTVar9 !=
        (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppTVar9 = ppTVar9 + 1) {
      (*(*ppTVar9)->_vptr_Texture2D[2])();
    }
  }
  else {
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(this_00,1);
    local_98.valueMin.m_data._0_8_ =
         glu::Texture2D::create
                   (this->m_renderCtx,this->m_renderCtxInfo,
                    ((this->super_TestCase).super_TestNode.m_testCtx)->m_curArchive,
                    (int)((ulong)((long)(this->m_filenames).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_filenames).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5),
                    &this->m_filenames);
    std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::emplace_back<glu::Texture2D*>
              ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
               (Texture2D **)&local_98);
  }
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var,iVar3);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  if (0x3f < iVar3) {
    iVar3 = 0x40;
  }
  local_108._0_4_ = (float)iVar3;
  iVar3 = *(int *)(CONCAT44(extraout_var_00,iVar4) + 4);
  iVar4 = 0x40;
  if (iVar3 < 0x40) {
    iVar4 = iVar3;
  }
  local_108._4_4_ = (float)iVar4;
  afStack_100[0] = 0.0;
  afStack_100[1] = 0.0;
  lVar8 = 0xc;
  do {
    iVar3 = *(int *)(&UNK_01bc0c04 + lVar8);
    ppTVar9 = (this->m_textures).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar4 = (int)((ulong)((long)(this->m_textures).
                                super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar9) >> 3) +
            -1;
    if (iVar3 < iVar4) {
      iVar4 = iVar3;
    }
    if (iVar3 < 0) {
      iVar4 = 0;
    }
    local_e8._0_4_ = expf(*(float *)(&UNK_01bc0c08 + lVar8) * 0.6931472);
    local_e8._4_4_ = extraout_XMM0_Db;
    fStack_e0 = (float)extraout_XMM0_Dc;
    fStack_dc = (float)extraout_XMM0_Dd;
    pTVar5 = ppTVar9[iVar4];
    local_d8 = *(Texture2D **)((long)&DAT_01bc0c10 + lVar8);
    uStack_d0 = 0;
    _local_f8 = ZEXT416((uint)(pTVar5->m_refTexture).m_width);
    fVar12 = expf(*(float *)(&UNK_01bc0c0c + lVar8) * 0.6931472);
    auVar13._0_4_ = (float)local_e8._0_4_ * (float)local_108;
    auVar13._4_4_ = fVar12 * local_108._4_4_;
    auVar13._8_4_ = (float)local_e8._4_4_ * afStack_100[0];
    auVar13._12_4_ = extraout_XMM0_Db_00 * afStack_100[1];
    auVar14._4_4_ = (float)(pTVar5->m_refTexture).m_height;
    auVar14._0_4_ = (float)(int)local_f8._0_4_;
    auVar14._8_4_ = (float)(int)local_f8._4_4_;
    auVar14._12_4_ = 0;
    auVar14 = divps(auVar13,auVar14);
    local_98.valueMax.m_data[0] = auVar14._0_4_ + (float)local_d8;
    local_98.valueMax.m_data[1] = auVar14._4_4_ + local_d8._4_4_;
    local_98.valueMin.m_data[2] = (float)local_d8;
    local_98.valueMin.m_data[3] = local_d8._4_4_;
    local_98.valueMin.m_data._0_8_ = pTVar5;
    std::
    vector<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>
              (&this->m_cases,(FilterCase *)&local_98);
    lVar8 = lVar8 + 0x14;
  } while (lVar8 != 0x5c);
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return extraout_EAX;
}

Assistant:

void Texture2DFilteringCase::init (void)
{
	try
	{
		if (!m_filenames.empty())
		{
			m_textures.reserve(1);
			m_textures.push_back(glu::Texture2D::create(m_renderCtx, m_renderCtxInfo, m_testCtx.getArchive(), (int)m_filenames.size(), m_filenames));
		}
		else
		{
			// Create 2 textures.
			m_textures.reserve(2);
			for (int ndx = 0; ndx < 2; ndx++)
				m_textures.push_back(new glu::Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height));

			bool					mipmaps		= deIsPowerOfTwo32(m_width) && deIsPowerOfTwo32(m_height);
			int						numLevels	= mipmaps ? deLog2Floor32(de::max(m_width, m_height))+1 : 1;
			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
			tcu::Vec4				cBias		= fmtInfo.valueMin;
			tcu::Vec4				cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill first gradient texture.
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				tcu::Vec4 gMin = tcu::Vec4(-0.5f, -0.5f, -0.5f, 2.0f)*cScale + cBias;
				tcu::Vec4 gMax = tcu::Vec4( 1.0f,  1.0f,  1.0f, 0.0f)*cScale + cBias;

				m_textures[0]->getRefTexture().allocLevel(levelNdx);
				tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevel(levelNdx), gMin, gMax);
			}

			// Fill second with grid texture.
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				deUint32	step	= 0x00ffffff / numLevels;
				deUint32	rgb		= step*levelNdx;
				deUint32	colorA	= 0xff000000 | rgb;
				deUint32	colorB	= 0xff000000 | ~rgb;

				m_textures[1]->getRefTexture().allocLevel(levelNdx);
				tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}

			// Upload.
			for (std::vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
				(*i)->upload();
		}

		// Compute cases.
		{
			const struct
			{
				int		texNdx;
				float	lodX;
				float	lodY;
				float	oX;
				float	oY;
			} cases[] =
			{
				{ 0,	1.6f,	2.9f,	-1.0f,	-2.7f	},
				{ 0,	-2.0f,	-1.35f,	-0.2f,	0.7f	},
				{ 1,	0.14f,	0.275f,	-1.5f,	-1.1f	},
				{ 1,	-0.92f,	-2.64f,	0.4f,	-0.1f	},
			};

			const float	viewportW	= (float)de::min<int>(VIEWPORT_WIDTH, m_renderCtx.getRenderTarget().getWidth());
			const float	viewportH	= (float)de::min<int>(VIEWPORT_HEIGHT, m_renderCtx.getRenderTarget().getHeight());

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
			{
				const int	texNdx	= de::clamp(cases[caseNdx].texNdx, 0, (int)m_textures.size()-1);
				const float	lodX	= cases[caseNdx].lodX;
				const float	lodY	= cases[caseNdx].lodY;
				const float	oX		= cases[caseNdx].oX;
				const float	oY		= cases[caseNdx].oY;
				const float	sX		= deFloatExp2(lodX)*viewportW / float(m_textures[texNdx]->getRefTexture().getWidth());
				const float	sY		= deFloatExp2(lodY)*viewportH / float(m_textures[texNdx]->getRefTexture().getHeight());

				m_cases.push_back(FilterCase(m_textures[texNdx], tcu::Vec2(oX, oY), tcu::Vec2(oX+sX, oY+sY)));
			}
		}

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		Texture2DFilteringCase::deinit();
		throw;
	}
}